

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

uint Rsb_DecPerformInt(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,int nGsAll,int fFindAll)

{
  int iVar1;
  word *pCexes_00;
  word wVar2;
  int local_e8;
  int local_e4;
  int nCexes;
  int iCexB;
  int iCexA;
  int n;
  int j;
  int k;
  int i;
  uint uTruth;
  word *pDivs [16];
  uint *pPat;
  word *pCexes;
  int nGsAll_local;
  int nGs_local;
  word **g_local;
  word *f_local;
  int nVars_local;
  Rsb_Man_t *p_local;
  
  pCexes_00 = Vec_WrdArray(p->vCexes);
  pDivs[0xf] = (word *)Vec_IntArray(p->vDecPats);
  k = 0;
  local_e8 = 0;
  memset(pCexes_00,0,(long)nGsAll << 3);
  Vec_IntClear(p->vTries);
  p->vFanins->nSize = 1;
  j = 0;
  do {
    if (nGs <= j) {
      if (p->nDecMax != 1) {
        p->vFanins->nSize = 2;
        for (j = 1; j < nGs; j = j + 1) {
          for (n = 0; n < j; n = n + 1) {
            if ((pCexes_00[j] & pCexes_00[n]) == 0) {
              _i = g[j];
              *p->vFanins->pArray = j;
              pDivs[0] = g[n];
              p->vFanins->pArray[1] = n;
              iVar1 = Vec_IntSize(p->vFanins);
              k = Rsb_DecCheck(nVars,f,(word **)&i,iVar1,(uint *)pDivs[0xf],&nCexes,&local_e4);
              if (k == 0) {
                if (local_e8 == 0x40) {
                  return 0;
                }
                iVar1 = Vec_IntSize(p->vFanins);
                Rsb_DecVerifyCex(f,(word **)&i,iVar1,nCexes,local_e4);
                iVar1 = local_e8 + 1;
                Rsb_DecRecordCex(g,nGsAll,nCexes,local_e4,pCexes_00,local_e8);
                local_e8 = iVar1;
                if (p->fVerbose != 0) {
                  Vec_IntPush(p->vTries,j);
                  Vec_IntPush(p->vTries,n);
                  Vec_IntPush(p->vTries,-1);
                }
              }
              else {
                if (fFindAll == 0) {
                  return k;
                }
                wVar2 = Abc_Tt6Stretch((ulong)(uint)k,2);
                k = (int)wVar2;
                Kit_DsdPrintFromTruth((uint *)&k,2);
                printf("   ");
                Vec_IntPrint(p->vFanins);
              }
            }
          }
        }
        if (p->nDecMax != 2) {
          p->vFanins->nSize = 3;
          for (j = 2; j < nGs; j = j + 1) {
            for (n = 1; n < j; n = n + 1) {
              for (iCexA = 0; iCexA < n; iCexA = iCexA + 1) {
                if ((pCexes_00[j] & pCexes_00[n] & pCexes_00[iCexA]) == 0) {
                  _i = g[j];
                  *p->vFanins->pArray = j;
                  pDivs[0] = g[n];
                  p->vFanins->pArray[1] = n;
                  pDivs[1] = g[iCexA];
                  p->vFanins->pArray[2] = iCexA;
                  iVar1 = Vec_IntSize(p->vFanins);
                  k = Rsb_DecCheck(nVars,f,(word **)&i,iVar1,(uint *)pDivs[0xf],&nCexes,&local_e4);
                  if (k == 0) {
                    if (local_e8 == 0x40) {
                      return 0;
                    }
                    iVar1 = Vec_IntSize(p->vFanins);
                    Rsb_DecVerifyCex(f,(word **)&i,iVar1,nCexes,local_e4);
                    iVar1 = local_e8 + 1;
                    Rsb_DecRecordCex(g,nGsAll,nCexes,local_e4,pCexes_00,local_e8);
                    local_e8 = iVar1;
                    if (p->fVerbose != 0) {
                      Vec_IntPush(p->vTries,j);
                      Vec_IntPush(p->vTries,n);
                      Vec_IntPush(p->vTries,iCexA);
                      Vec_IntPush(p->vTries,-1);
                    }
                  }
                  else {
                    if (fFindAll == 0) {
                      return k;
                    }
                    wVar2 = Abc_Tt6Stretch((ulong)(uint)k,3);
                    k = (int)wVar2;
                    Kit_DsdPrintFromTruth((uint *)&k,3);
                    printf("   ");
                    Vec_IntPrint(p->vFanins);
                  }
                }
              }
            }
          }
          if (p->nDecMax != 3) {
            p->vFanins->nSize = 4;
            for (j = 3; j < nGs; j = j + 1) {
              for (n = 2; n < j; n = n + 1) {
                for (iCexA = 1; iCexA < n; iCexA = iCexA + 1) {
                  for (iCexB = 0; iCexB < iCexA; iCexB = iCexB + 1) {
                    if ((pCexes_00[j] & pCexes_00[n] & pCexes_00[iCexA] & pCexes_00[iCexB]) == 0) {
                      _i = g[j];
                      *p->vFanins->pArray = j;
                      pDivs[0] = g[n];
                      p->vFanins->pArray[1] = n;
                      pDivs[1] = g[iCexA];
                      p->vFanins->pArray[2] = iCexA;
                      pDivs[2] = g[iCexB];
                      p->vFanins->pArray[3] = iCexB;
                      iVar1 = Vec_IntSize(p->vFanins);
                      k = Rsb_DecCheck(nVars,f,(word **)&i,iVar1,(uint *)pDivs[0xf],&nCexes,
                                       &local_e4);
                      if (k == 0) {
                        if (local_e8 == 0x40) {
                          return 0;
                        }
                        iVar1 = Vec_IntSize(p->vFanins);
                        Rsb_DecVerifyCex(f,(word **)&i,iVar1,nCexes,local_e4);
                        iVar1 = local_e8 + 1;
                        Rsb_DecRecordCex(g,nGsAll,nCexes,local_e4,pCexes_00,local_e8);
                        local_e8 = iVar1;
                        if (p->fVerbose != 0) {
                          Vec_IntPush(p->vTries,j);
                          Vec_IntPush(p->vTries,n);
                          Vec_IntPush(p->vTries,iCexA);
                          Vec_IntPush(p->vTries,iCexB);
                          Vec_IntPush(p->vTries,-1);
                        }
                      }
                      else {
                        if (fFindAll == 0) {
                          return k;
                        }
                        wVar2 = Abc_Tt6Stretch((ulong)(uint)k,4);
                        k = (int)wVar2;
                        Kit_DsdPrintFromTruth((uint *)&k,4);
                        printf("   ");
                        Vec_IntPrint(p->vFanins);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      return 0;
    }
    if (pCexes_00[j] == 0) {
      _i = g[j];
      *p->vFanins->pArray = j;
      iVar1 = Vec_IntSize(p->vFanins);
      k = Rsb_DecCheck(nVars,f,(word **)&i,iVar1,(uint *)pDivs[0xf],&nCexes,&local_e4);
      if (k == 0) {
        if (local_e8 == 0x40) {
          return 0;
        }
        iVar1 = Vec_IntSize(p->vFanins);
        Rsb_DecVerifyCex(f,(word **)&i,iVar1,nCexes,local_e4);
        iVar1 = local_e8 + 1;
        Rsb_DecRecordCex(g,nGsAll,nCexes,local_e4,pCexes_00,local_e8);
        local_e8 = iVar1;
        if (p->fVerbose != 0) {
          Vec_IntPush(p->vTries,j);
          Vec_IntPush(p->vTries,-1);
        }
      }
      else {
        if (fFindAll == 0) {
          return k;
        }
        wVar2 = Abc_Tt6Stretch((ulong)(uint)k,1);
        k = (int)wVar2;
        Kit_DsdPrintFromTruth((uint *)&k,1);
        printf("   ");
        Vec_IntPrint(p->vFanins);
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

unsigned Rsb_DecPerformInt( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, int nGsAll, int fFindAll ) 
{
    word * pCexes = Vec_WrdArray(p->vCexes);
    unsigned * pPat = (unsigned *)Vec_IntArray(p->vDecPats);
    /*
    The following filtering hueristic can be used:
    after the first round (if there is more than 5 cexes, 
    remove all the divisors, except fanins of the node
    This should lead to a speadup without sacrifying quality.

    Another idea is to precompute several counter-examples
    like the first and last 0 and 1 mints of the function
    which yields 4 cexes.
    */

    word * pDivs[16];
    unsigned uTruth = 0;
    int i, k, j, n, iCexA, iCexB, nCexes = 0;
    memset( pCexes, 0, sizeof(word) * nGsAll );  
    Vec_IntClear( p->vTries );
    // populate the counter-examples with the three most obvious
//    nCexes = Rsb_DecInitCexes( nVars, f, g, nGs, nGsAll, pCexes, vTries );
    // start by checking each function
    p->vFanins->nSize = 1;
    for ( i = 0; i < nGs; i++ )
    {
        if ( pCexes[i] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 1 );
                Kit_DsdPrintFromTruth( &uTruth, 1 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 1 )
        return 0;
    // continue by checking pairs
    p->vFanins->nSize = 2;
    for ( i = 1; i < nGs; i++ )
    for ( k = 0; k < i; k++ )
    {
        if ( pCexes[i] & pCexes[k] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 2 );
                Kit_DsdPrintFromTruth( &uTruth, 2 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 2 )
        return 0;
    // continue by checking triples
    p->vFanins->nSize = 3;
    for ( i = 2; i < nGs; i++ )
    for ( k = 1; k < i; k++ )
    for ( j = 0; j < k; j++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 3 );
                Kit_DsdPrintFromTruth( &uTruth, 3 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 3 )
        return 0;
    // continue by checking quadras
    p->vFanins->nSize = 4;
    for ( i = 3; i < nGs; i++ )
    for ( k = 2; k < i; k++ )
    for ( j = 1; j < k; j++ )
    for ( n = 0; n < j; n++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] & pCexes[n] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        pDivs[3] = g[n];  p->vFanins->pArray[3] = n;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 4 );
                Kit_DsdPrintFromTruth( &uTruth, 4 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, n );
        Vec_IntPush( p->vTries, -1 );
    }
//    printf( "%d ", nCexes );
    if ( p->nDecMax == 4 )
        return 0;
    return 0;
}